

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_fixture.c
# Opt level: O3

int test_auth_pubkey(LIBSSH2_SESSION *session,int flags,char *username,char *password,char *fn_pub,
                    char *fn_priv)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  FILE *__stream;
  void *__ptr;
  size_t sVar5;
  
  iVar1 = openssh_fixture_have_docker();
  if ((iVar1 == 0) && (iVar1 = strcmp(username,"libssh2"), iVar1 == 0)) {
    username = getenv("USER");
  }
  sVar2 = strlen(username);
  pcVar3 = (char *)libssh2_userauth_list(session,username,sVar2 & 0xffffffff);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = "libssh2_userauth_list";
  }
  else {
    pcVar4 = strstr(pcVar3,"publickey");
    if (pcVar4 == (char *)0x0) {
      fprintf(_stderr,"\'publickey\' was expected in userauth list: %s\n",pcVar3);
      return 1;
    }
    if ((flags & 2U) == 0) {
      sVar2 = strlen(username);
      pcVar3 = srcdir_path(fn_pub);
      pcVar4 = srcdir_path(fn_priv);
      iVar1 = libssh2_userauth_publickey_fromfile_ex
                        (session,username,sVar2 & 0xffffffff,pcVar3,pcVar4,password);
    }
    else {
      pcVar3 = srcdir_path(fn_priv);
      __stream = fopen(pcVar3,"r");
      if (__stream == (FILE *)0x0) {
        fprintf(_stderr,"File could not be read: %s\n",pcVar3);
LAB_00102f6b:
        test_auth_pubkey_cold_3();
        return 1;
      }
      fseek(__stream,0,2);
      sVar2 = ftell(__stream);
      rewind(__stream);
      __ptr = calloc(1,sVar2 + 1);
      if (__ptr == (void *)0x0) {
        test_auth_pubkey_cold_2();
        goto LAB_00102f6b;
      }
      sVar5 = fread(__ptr,sVar2,1,__stream);
      fclose(__stream);
      if (sVar5 != 1) {
        test_auth_pubkey_cold_1();
        goto LAB_00102f6b;
      }
      sVar5 = strlen(username);
      iVar1 = libssh2_userauth_publickey_frommemory(session,username,sVar5,0,0,__ptr,sVar2,0);
      free(__ptr);
    }
    if ((flags & 1U) != 0) {
      if (iVar1 == 0) {
        test_auth_pubkey_cold_4();
        return 1;
      }
      return 0;
    }
    if (iVar1 == 0) {
      return 0;
    }
    pcVar3 = "libssh2_userauth_publickey_fromfile_ex";
  }
  print_last_session_error(pcVar3);
  return 1;
}

Assistant:

int test_auth_pubkey(LIBSSH2_SESSION *session, int flags,
                     const char *username,
                     const char *password,
                     const char *fn_pub,
                     const char *fn_priv)
{
    int rc;
    const char *userauth_list;

    /* Ignore our hard-wired Dockerfile user when not running under Docker */
    if(!openssh_fixture_have_docker() && strcmp(username, "libssh2") == 0) {
        username = getenv("USER");
#ifdef WIN32
        if(!username)
            username = getenv("USERNAME");
#endif
    }

    userauth_list = libssh2_userauth_list(session, username,
                                          (unsigned int)strlen(username));
    if(!userauth_list) {
        print_last_session_error("libssh2_userauth_list");
        return 1;
    }

    if(!strstr(userauth_list, "publickey")) {
        fprintf(stderr, "'publickey' was expected in userauth list: %s\n",
                userauth_list);
        return 1;
    }

    if((flags & TEST_AUTH_FROMMEM) != 0) {
        char *buffer = NULL;
        size_t len = 0;

        if(read_file(srcdir_path(fn_priv), &buffer, &len)) {
            fprintf(stderr, "Reading key file failed.\n");
            return 1;
        }

        rc = libssh2_userauth_publickey_frommemory(session,
                                                   username, strlen(username),
                                                   NULL, 0,
                                                   buffer, len,
                                                   NULL);

        free(buffer);
    }
    else {
        rc = libssh2_userauth_publickey_fromfile_ex(session, username,
                                                (unsigned int)strlen(username),
                                                    srcdir_path(fn_pub),
                                                    srcdir_path(fn_priv),
                                                    password);
    }

    if((flags & TEST_AUTH_SHOULDFAIL) != 0) {
        if(rc == 0) {
            fprintf(stderr, "Public-key auth succeeded with wrong key\n");
            return 1;
        }
    }
    else {
        if(rc) {
            print_last_session_error("libssh2_userauth_publickey_fromfile_ex");
            return 1;
        }
    }

    return 0;
}